

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O1

ParallelThreadData * __thiscall
JsUtil::BackgroundJobProcessor::GetThreadDataFromCurrentJob(BackgroundJobProcessor *this,Job *job)

{
  Job *pJVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  bVar3 = CCLock::IsLocked(&(this->criticalSection).super_CCLock);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x35d,"(criticalSection.IsLocked())","criticalSection.IsLocked()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if ((ulong)this->threadCount != 0) {
    uVar5 = 0;
    do {
      pJVar1 = this->parallelThreadData[uVar5]->currentJob;
      if (pJVar1 != (Job *)0x0 && pJVar1 == job) {
        return this->parallelThreadData[uVar5];
      }
      uVar5 = uVar5 + 1;
    } while (this->threadCount != uVar5);
  }
  return (ParallelThreadData *)0x0;
}

Assistant:

ParallelThreadData * BackgroundJobProcessor::GetThreadDataFromCurrentJob(Job* job)
    {
        Assert(criticalSection.IsLocked());
        ParallelThreadData *currentThreadData = nullptr;
        this->IterateBackgroundThreads([&](ParallelThreadData* threadData)
        {
            if (!threadData->currentJob)
            {
                return false;
            }
            if (threadData->currentJob != job)
            {
                return false;
            }
            currentThreadData = threadData;
            return true;
        }
        );
        return currentThreadData;
    }